

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  FILE *__stream;
  Message *pMVar1;
  int in_ECX;
  Message errors;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  char *local_50;
  String local_48;
  string local_38;
  
  local_50 = test_case_name;
  Message::Message((Message *)&local_58);
  pMVar1 = Message::operator<<((Message *)&local_58,
                               (char (*) [37])"Attempted redefinition of test case ");
  pMVar1 = Message::operator<<(pMVar1,&local_50);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x18d3a7);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [64])
                                      "All tests in the same test case must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [31])"class.  However, in test case ");
  pMVar1 = Message::operator<<(pMVar1,&local_50);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [12])0x18d0d8);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(&local_38,(internal *)file,(char *)(ulong)(uint)line,in_ECX);
  StringStreamToString((internal *)&local_48,local_58.ptr_);
  fprintf(__stream,"%s %s",local_38._M_dataplus._M_p,local_48.c_str_);
  String::~String(&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_58);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}